

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_deserialize_list_element
          (t_cpp_generator *this,ostream *out,t_list *tlist,string *prefix,bool use_push,
          string *index)

{
  t_type *ptVar1;
  ostream *poVar2;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  t_field felem_1;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  string local_160;
  undefined1 local_140 [8];
  t_field felem;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  string elem;
  string *index_local;
  bool use_push_local;
  string *prefix_local;
  t_list *tlist_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  elem.field_2._8_8_ = index;
  if (use_push) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"_elem",&local_79);
    t_generator::tmp((string *)local_58,(t_generator *)this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    ptVar1 = t_list::get_elem_type(tlist);
    std::__cxx11::string::string((string *)&local_160,(string *)local_58);
    t_field::t_field((t_field *)local_140,ptVar1,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    poVar2 = t_generator::indent((t_generator *)this,out);
    declare_field_abi_cxx11_(&local_180,this,(t_field *)local_140,false,false,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_180);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"",(allocator *)&felem_1.field_0xaf);
    generate_deserialize_field(this,out,(t_field *)local_140,&local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&felem_1.field_0xaf);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,".push_back(");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_field::~t_field((t_field *)local_140);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    ptVar1 = t_list::get_elem_type(tlist);
    std::operator+(&local_2e0,prefix,"[");
    std::operator+(&local_2c0,&local_2e0,index);
    std::operator+(&local_2a0,&local_2c0,"]");
    t_field::t_field((t_field *)local_280,ptVar1,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"",&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_328,"",&local_329);
    generate_deserialize_field(this,out,(t_field *)local_280,&local_300,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    t_field::~t_field((t_field *)local_280);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_list_element(ostream& out,
                                                        t_list* tlist,
                                                        string prefix,
                                                        bool use_push,
                                                        string index) {
  if (use_push) {
    string elem = tmp("_elem");
    t_field felem(tlist->get_elem_type(), elem);
    indent(out) << declare_field(&felem) << endl;
    generate_deserialize_field(out, &felem);
    indent(out) << prefix << ".push_back(" << elem << ");" << endl;
  } else {
    t_field felem(tlist->get_elem_type(), prefix + "[" + index + "]");
    generate_deserialize_field(out, &felem);
  }
}